

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

bool __thiscall
QScroller::handleInput(QScroller *this,Input input,QPointF *position,qint64 timestamp)

{
  qreal *this_00;
  QScrollerPrivate *pQVar1;
  undefined1 uVar2;
  QDebug *pQVar3;
  char *t;
  code *pcVar4;
  undefined **ppuVar5;
  int i;
  ulong uVar6;
  long in_FS_OFFSET;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 uStack_68;
  undefined4 local_64;
  char *local_60;
  QDebug local_50;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->d_ptr;
  lcScroller();
  uVar2 = lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i;
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78._0_4_ = 2;
    local_78._4_4_ = 0;
    uStack_70._0_4_ = 0;
    uStack_70._4_4_ = 0;
    uStack_68 = 0;
    local_64 = 0;
    local_60 = lcScroller::category.name;
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<(&local_50,"QScroller::handleInput(");
    pQVar3 = QDebug::operator<<(pQVar3,input);
    pQVar3 = QDebug::operator<<(pQVar3,", ");
    t = QScrollerPrivate::stateName(pQVar1->state);
    pQVar3 = QDebug::operator<<(pQVar3,t);
    pQVar3 = QDebug::operator<<(pQVar3,", ");
    local_48.xp = (qreal)pQVar3->stream;
    *(int *)((long)local_48.xp + 0x28) = *(int *)((long)local_48.xp + 0x28) + 1;
    this_00 = &local_48.yp;
    ::operator<<((QDebug)this_00,&local_48);
    pQVar3 = QDebug::operator<<((QDebug *)this_00,", ");
    pQVar3 = QDebug::operator<<(pQVar3,timestamp);
    QDebug::operator<<(pQVar3,')');
    QDebug::~QDebug((QDebug *)this_00);
    QDebug::~QDebug((QDebug *)&local_48);
    uVar2 = QDebug::~QDebug(&local_50);
  }
  ppuVar5 = &PTR_pressWhileInactive_007efa08;
  uVar6 = 0;
  do {
    if (uVar6 == 6) {
LAB_005dc7ae:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return (bool)(uVar6 < 6 & uVar2);
      }
      __stack_chk_fail();
    }
    if ((pQVar1->state == *(State *)(ppuVar5 + -1)) && (*(Input *)((long)ppuVar5 + -4) == input)) {
      pcVar4 = (code *)*ppuVar5;
      if (((ulong)pcVar4 & 1) != 0) {
        pcVar4 = *(code **)(pcVar4 + *(long *)pQVar1 + -1);
      }
      local_78 = position->xp - (pQVar1->overshootPosition).xp;
      uStack_70 = position->yp - (pQVar1->overshootPosition).yp;
      uVar2 = (*pcVar4)(pQVar1,&local_78,timestamp);
      goto LAB_005dc7ae;
    }
    uVar6 = uVar6 + 1;
    ppuVar5 = ppuVar5 + 3;
  } while( true );
}

Assistant:

bool QScroller::handleInput(Input input, const QPointF &position, qint64 timestamp)
{
    Q_D(QScroller);

    qCDebug(lcScroller) << "QScroller::handleInput(" << input << ", " << d->stateName(d->state)
                        << ", " << position << ", " << timestamp << ')';
    struct statechange {
        State state;
        Input input;
        typedef bool (QScrollerPrivate::*inputhandler_t)(const QPointF &position, qint64 timestamp);
        inputhandler_t handler;
    };

    statechange statechanges[] = {
        { QScroller::Inactive,  InputPress,   &QScrollerPrivate::pressWhileInactive },
        { QScroller::Pressed,   InputMove,    &QScrollerPrivate::moveWhilePressed },
        { QScroller::Pressed,   InputRelease, &QScrollerPrivate::releaseWhilePressed },
        { QScroller::Dragging,  InputMove,    &QScrollerPrivate::moveWhileDragging },
        { QScroller::Dragging,  InputRelease, &QScrollerPrivate::releaseWhileDragging },
        { QScroller::Scrolling, InputPress,   &QScrollerPrivate::pressWhileScrolling }
    };

    for (int i = 0; i < int(sizeof(statechanges) / sizeof(*statechanges)); ++i) {
        statechange *sc = statechanges + i;

         if (d->state == sc->state && input == sc->input)
             return (d->*sc->handler)(position - d->overshootPosition, timestamp);
    }
    return false;
}